

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

optional<long> __thiscall
anon_unknown.dwarf_20069f2::WSHDescriptor::MaxSatSize(WSHDescriptor *this,bool use_max_sig)

{
  long lVar1;
  _Storage<long,_true> _Var2;
  ulong uVar3;
  undefined8 uVar4;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  optional<long> oVar7;
  long lStack_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  auVar5 = (**(code **)(*(long *)(((this->super_DescriptorImpl).m_subdescriptor_args.
                                   super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                 super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                                 ._M_t + 0xa0))();
  _Var2._M_value = auVar5._0_8_;
  if ((auVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    auVar6 = (**(code **)(*(long *)(((this->super_DescriptorImpl).m_subdescriptor_args.
                                     super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                   super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                                   ._M_t + 0x60))();
    uVar3 = auVar6._8_8_;
    _Var2._M_value = auVar6._0_8_;
    if ((auVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if ((ulong)_Var2 < 0xfd) {
        lStack_20 = 1;
      }
      else if ((ulong)_Var2 < 0x10000) {
        lStack_20 = 3;
      }
      else {
        uVar3 = (ulong)_Var2._M_value >> 0x20;
        lStack_20 = (ulong)(uVar3 != 0) * 4 + 5;
      }
      _Var2._M_value = _Var2._M_value + auVar5._0_8_ + lStack_20;
      uVar4 = CONCAT71((int7)(uVar3 >> 8),1);
      goto LAB_005d08a5;
    }
  }
  uVar4 = 0;
LAB_005d08a5:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  oVar7.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_ =
       uVar4;
  oVar7.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = _Var2._M_value;
  return (optional<long>)
         oVar7.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>;
}

Assistant:

std::optional<int64_t> MaxSatSize(bool use_max_sig) const override {
        if (const auto sat_size = m_subdescriptor_args[0]->MaxSatSize(use_max_sig)) {
            if (const auto subscript_size = m_subdescriptor_args[0]->ScriptSize()) {
                return GetSizeOfCompactSize(*subscript_size) + *subscript_size + *sat_size;
            }
        }
        return {};
    }